

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::handleStartOptions(ClaspAppBase *this,ClaspFacade *clasp)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ProgramBuilder *fn;
  AbstractProgram *this_00;
  LogicProgram *in_RDI;
  SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> prgTemp;
  Lit_t lit;
  LogicProgram *in_stack_ffffffffffffff58;
  LogicProgramAdapter *in_stack_ffffffffffffff60;
  ProgramBuilder *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  LitSpan *in_stack_ffffffffffffff98;
  LemmaIn *in_stack_ffffffffffffffa0;
  Head_t in_stack_ffffffffffffffb4;
  SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> local_40;
  Span<int> local_38;
  Span<unsigned_int> local_28;
  Head_t local_18;
  Lit_t local_14 [5];
  
  bVar1 = ClaspFacade::incremental((ClaspFacade *)0x118b51);
  if (!bVar1) {
    ClaspCliConfig::releaseOptions((ClaspCliConfig *)0x118b63);
  }
  if (*(int *)&in_RDI[1].field_0x64 != 0) {
    ClaspFacade::program((ClaspFacade *)0x118b82);
    iVar2 = ProgramBuilder::type((ProgramBuilder *)0x118b8a);
    if (iVar2 == 2) {
      local_14[0] = Potassco::neg(*(Lit_t *)&in_RDI[1].field_0x64);
      in_stack_ffffffffffffffa0 = (LemmaIn *)ClaspFacade::program((ClaspFacade *)0x118bb7);
      Potassco::Head_t::Head_t(&local_18,Disjunctive);
      local_28 = Potassco::toSpan<unsigned_int>();
      local_38 = Potassco::toSpan<int>(local_14,1);
      Asp::LogicProgram::addRule
                (in_RDI,in_stack_ffffffffffffffb4,(AtomSpan *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::SingleOwnerPtr(&local_40);
    fn = ClaspFacade::program((ClaspFacade *)0x118c4e);
    iVar2 = ProgramBuilder::type((ProgramBuilder *)0x118c5f);
    if (iVar2 == 2) {
      operator_new(0x18);
      ClaspFacade::program((ClaspFacade *)0x118c8c);
      Asp::LogicProgramAdapter::LogicProgramAdapter
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::operator=
                ((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)
                 in_stack_ffffffffffffff60,(AbstractProgram *)in_stack_ffffffffffffff58);
    }
    else {
      operator_new(0x38);
      ClaspFacade::program((ClaspFacade *)0x118d08);
      BasicProgramAdapter::BasicProgramAdapter
                ((BasicProgramAdapter *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::operator=
                ((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)
                 in_stack_ffffffffffffff60,(AbstractProgram *)in_stack_ffffffffffffff58);
    }
    operator_new(0x240);
    in_RDI = in_RDI + 1;
    this_00 = SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::release
                        ((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)
                         in_stack_ffffffffffffff60);
    handleStartOptions(Clasp::ClaspFacade&)::LemmaIn::LemmaIn(std::__cxx11::string_const&,Potassco::
    AbstractProgram__(in_stack_ffffffffffffffa0,(string *)fn,
                      (PrgAdapter *)CONCAT44(iVar2,in_stack_ffffffffffffff90));
    SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *)this_00,
               (ProgramReader *)in_RDI);
    SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::~SingleOwnerPtr
              ((SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> *)0x118db8);
  }
  return;
}

Assistant:

void ClaspAppBase::handleStartOptions(ClaspFacade& clasp) {
	if (!clasp.incremental()) {
		claspConfig_.releaseOptions();
	}
	if (claspAppOpts_.compute && clasp.program()->type() == Problem_t::Asp) {
		Potassco::Lit_t lit = Potassco::neg(claspAppOpts_.compute);
		static_cast<Asp::LogicProgram*>(clasp.program())->addRule(Potassco::Head_t::Disjunctive, Potassco::toSpan<Potassco::Atom_t>(), Potassco::toSpan(&lit, 1));
	}
	if (!claspAppOpts_.lemmaIn.empty()) {
		class LemmaIn : public Potassco::AspifInput {
		public:
			typedef Potassco::AbstractProgram PrgAdapter;
			LemmaIn(const std::string& fn, PrgAdapter* prg) : Potassco::AspifInput(*prg), prg_(prg) {
				if (!isStdIn(fn)) { file_.open(fn.c_str()); }
				POTASSCO_REQUIRE(accept(getStream()), "'lemma-in': invalid input file!");
			}
			~LemmaIn() { delete prg_; }
		private:
			std::istream& getStream() { return file_.is_open() ? file_ : std::cin; }
			PrgAdapter*   prg_;
			std::ifstream file_;
		};
		SingleOwnerPtr<Potassco::AbstractProgram> prgTemp;
		if (clasp.program()->type() == Problem_t::Asp) { prgTemp = new Asp::LogicProgramAdapter(*static_cast<Asp::LogicProgram*>(clasp.program())); }
		else { prgTemp = new BasicProgramAdapter(*clasp.program()); }
		lemmaIn_ = new LemmaIn(claspAppOpts_.lemmaIn, prgTemp.release());
	}
}